

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O0

ssize_t __thiscall ktx::OutputStream::write(OutputStream *this,int __fd,void *__buf,size_t __n)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_2;
  undefined4 in_register_00000034;
  void *__ptr;
  size_t written;
  string local_78 [32];
  undefined1 local_58 [16];
  string local_48 [8];
  string_view in_stack_ffffffffffffffc0;
  ReturnCode return_code;
  Reporter *this_00;
  
  __ptr = (void *)CONCAT44(in_register_00000034,__fd);
  this_00 = (Reporter *)this;
  args_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           fwrite(__ptr,1,(size_t)__buf,(FILE *)this->file);
  return_code = (ReturnCode)((ulong)__ptr >> 0x20);
  if (args_2 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__buf) {
    local_58 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)this);
    fmtOutFile_abi_cxx11_(in_stack_ffffffffffffffc0);
    errnoMessage_abi_cxx11_();
    Reporter::fatal<char_const(&)[38],std::__cxx11::string,std::__cxx11::string>
              (this_00,return_code,(char (*) [38])__buf,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__n,args_2);
    std::__cxx11::string::~string(local_78);
    args_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::__cxx11::string::~string(local_48);
  }
  return (ssize_t)args_2;
}

Assistant:

void OutputStream::write(const char* data, std::size_t size, Reporter& report) {
    const auto written = std::fwrite(data, 1, size, file);
    if (written != size)
        report.fatal(rc::IO_FAILURE, "Failed to write output file \"{}\": {}.", fmtOutFile(filepath), errnoMessage());
}